

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O2

void __thiscall
MaterialSystemTest_testStringProperty_Test::MaterialSystemTest_testStringProperty_Test
          (MaterialSystemTest_testStringProperty_Test *this)

{
  MaterialSystemTest::MaterialSystemTest(&this->super_MaterialSystemTest);
  (this->super_MaterialSystemTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_007f1188;
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testStringProperty) {
    aiString s;
    s.Set("Hello, this is a small test");
    this->pcMat->AddProperty(&s,"testKey6");
    s.Set("358358");
    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey6",0,0,s));
    EXPECT_STREQ("Hello, this is a small test", s.data);
}